

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseEllipse(Lexer *this)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  char c;
  
  iVar3 = 0;
  while( true ) {
    pcVar1 = this->m_current;
    if (((*pcVar1 == '\0') || (this->m_end < pcVar1)) || (2 < iVar3)) break;
    if (*pcVar1 != '.') {
      Error<>(this,"Expected ellipse");
      return;
    }
    iVar3 = iVar3 + 1;
    sVar2 = GetUtf8CharSize(pcVar1);
    this->m_current = this->m_current + sVar2;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  ParseWhitespaceAndNewlines(this);
  if (*this->m_current == '\r') {
    sVar2 = GetUtf8CharSize(this->m_current);
    this->m_current = this->m_current + sVar2;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  pcVar1 = this->m_current;
  if ((*pcVar1 == '\n') && (pcVar1 <= this->m_end)) {
    sVar2 = GetUtf8CharSize(pcVar1);
    this->m_current = this->m_current + sVar2;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEllipse()
	{
		int count = 0;
		while (!IsEndOfText() && count < 3)
		{
			char c = *m_current;
			if (c != '.')
			{
				Error("Expected ellipse");
				return;
			}
			++count;
			AdvanceCurrent();
		}
		ParseWhitespaceAndNewlines();
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
	}